

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O2

int64_t socket_server_send(socket_server *ss,int id,void *buffer,int sz)

{
  ulong uVar1;
  int64_t iVar2;
  request_package request;
  
  uVar1 = (ulong)(uint)id & 0xffff;
  if ((ss->slot[uVar1].id == id) && (ss->slot[uVar1].type != 0)) {
    request.u.open.id = id;
    request.u.open.port = sz;
    request.u.send.buffer = (char *)buffer;
    send_request(ss,&request,'D',0x10);
    iVar2 = ss->slot[uVar1].wb_size;
  }
  else {
    free_buffer(ss,buffer,sz);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int64_t 
socket_server_send(struct socket_server *ss, int id, const void * buffer, int sz) {
	struct socket * s = &ss->slot[HASH_ID(id)];
	if (s->id != id || s->type == SOCKET_TYPE_INVALID) {
		free_buffer(ss, buffer, sz);
		return -1;
	}

	struct request_package request;
	request.u.send.id = id;
	request.u.send.sz = sz;
	request.u.send.buffer = (char *)buffer;

	send_request(ss, &request, 'D', sizeof(request.u.send));
	return s->wb_size;
}